

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction_widgets.cpp
# Opt level: O3

void __thiscall QtWidgetsActionPrivate::setMenu(QtWidgetsActionPrivate *this,QObject *menu)

{
  QAction *a;
  QObject *pQVar1;
  Data *pDVar2;
  QObject *pQVar3;
  Data *pDVar4;
  
  a = *(QAction **)&this->field_0x8;
  pQVar3 = (QObject *)QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
  pDVar4 = (this->m_menu).wp.d;
  if ((pDVar4 != (Data *)0x0) &&
     (pQVar1 = (this->m_menu).wp.value, pQVar1 != (QObject *)0x0 && *(int *)(pDVar4 + 4) != 0)) {
    QMenuPrivate::setOverrideMenuAction(*(QMenuPrivate **)(pQVar1 + 8),(QAction *)0x0);
  }
  if (pQVar3 == (QObject *)0x0) {
    pDVar4 = (Data *)0x0;
  }
  else {
    pDVar4 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar3);
  }
  pDVar2 = (this->m_menu).wp.d;
  (this->m_menu).wp.d = pDVar4;
  (this->m_menu).wp.value = pQVar3;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar2 = *(int *)pDVar2 + -1;
    UNLOCK();
    if (*(int *)pDVar2 == 0) {
      operator_delete(pDVar2);
    }
    pDVar4 = (this->m_menu).wp.d;
  }
  if ((pDVar4 != (Data *)0x0) &&
     (pQVar3 = (this->m_menu).wp.value, pQVar3 != (QObject *)0x0 && *(int *)(pDVar4 + 4) != 0)) {
    QMenuPrivate::setOverrideMenuAction(*(QMenuPrivate **)(pQVar3 + 8),a);
  }
  QActionPrivate::sendDataChanged();
  return;
}

Assistant:

void QtWidgetsActionPrivate::setMenu(QObject *menu)
{
    Q_Q(QAction);
    QMenu *theMenu = qobject_cast<QMenu*>(menu);
    Q_ASSERT_X(!menu || theMenu, "QAction::setMenu",
               "QAction::setMenu expects a QMenu* in widget applications");
    if (m_menu)
        m_menu->d_func()->setOverrideMenuAction(nullptr); //we reset the default action of any previous menu
    m_menu = theMenu;
    if (m_menu)
        m_menu->d_func()->setOverrideMenuAction(q);
    sendDataChanged();
}